

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O1

String __thiscall testing::internal::FlagToEnvVar(internal *this,char *flag)

{
  int iVar1;
  size_t sVar2;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  ostream *poVar4;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar5;
  long lVar6;
  String SVar7;
  Message env_var;
  String full_flag;
  char local_31;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  void *local_28;
  long local_20;
  size_t sVar3;
  
  Message::Message((Message *)&local_30);
  poVar4 = (ostream *)(local_30.ptr_ + 0x10);
  if (local_30.ptr_ ==
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    poVar4 = (ostream *)0x0;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"gtest_",6);
  if (flag == (char *)0x0) {
    sVar5.ptr_ = local_30.ptr_ + 0x10;
    sVar2 = 6;
    flag = "(null)";
  }
  else {
    sVar5.ptr_ = local_30.ptr_;
    if (local_30.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      sVar5.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_30.ptr_ + 0x10);
    }
    sVar2 = strlen(flag);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)sVar5.ptr_,flag,sVar2);
  StringStreamToString((internal *)&local_28,local_30.ptr_);
  if (local_30.ptr_ != (stringstream *)0x0) {
    (**(code **)(*(long *)local_30.ptr_ + 8))();
    local_30.ptr_ = (stringstream *)0x0;
  }
  Message::Message((Message *)&local_30);
  if (local_20 != 0) {
    lVar6 = 0;
    do {
      iVar1 = toupper((uint)*(byte *)((long)local_28 + lVar6));
      poVar4 = (ostream *)(local_30.ptr_ + 0x10);
      if (local_30.ptr_ == (stringstream *)0x0) {
        poVar4 = (ostream *)0x0;
      }
      local_31 = (char)iVar1;
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_31,1);
      lVar6 = lVar6 + 1;
    } while (lVar6 != local_20);
  }
  SVar7 = StringStreamToString(this,local_30.ptr_);
  sVar3 = SVar7.length_;
  if (local_30.ptr_ != (stringstream *)0x0) {
    (**(code **)(*(long *)local_30.ptr_ + 8))();
    local_30.ptr_ = (stringstream *)0x0;
    sVar3 = extraout_RDX;
  }
  if (local_28 != (void *)0x0) {
    operator_delete__(local_28);
    sVar3 = extraout_RDX_00;
  }
  SVar7.length_ = sVar3;
  SVar7.c_str_ = (char *)this;
  return SVar7;
}

Assistant:

static String FlagToEnvVar(const char* flag) {
  const String full_flag =
      (Message() << GTEST_FLAG_PREFIX_ << flag).GetString();

  Message env_var;
  for (size_t i = 0; i != full_flag.length(); i++) {
    env_var << ToUpper(full_flag.c_str()[i]);
  }

  return env_var.GetString();
}